

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

size_t __thiscall clipp::parser::occurrences_of(parser *this,parameter *p)

{
  bool bVar1;
  pointer this_00;
  size_t sVar2;
  undefined1 local_48 [24];
  reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>_>
  i;
  parameter *p_local;
  parser *this_local;
  
  if (p == (parameter *)0x0) {
    this_local = (parser *)0x0;
  }
  else {
    i.current._M_current =
         (__normal_iterator<const_clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>
          )(__normal_iterator<const_clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>
            )p;
    std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>::rbegin
              ((vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_> *)
               &stack0xffffffffffffffd0);
    std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>::rend
              ((vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_> *)
               (local_48 + 0x10));
    local_48._8_8_ = i.current._M_current;
    std::
    find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::arg_mapping_const*,std::vector<clipp::parser::arg_mapping,std::allocator<clipp::parser::arg_mapping>>>>,clipp::parser::occurrences_of(clipp::parameter_const*)const::_lambda(clipp::parser::arg_mapping_const&)_1_>
              ((reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>_>
                *)&stack0xffffffffffffffd8,
               (reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>_>
                *)&stack0xffffffffffffffd0,(parameter *)(local_48 + 0x10));
    std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>::rend
              ((vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_> *)
               local_48);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>_>
                             *)&stack0xffffffffffffffd8,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>_>
                             *)local_48);
    if (bVar1) {
      this_00 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>_>
                ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>_>
                              *)&stack0xffffffffffffffd8);
      sVar2 = arg_mapping::repeat(this_00);
      this_local = (parser *)(sVar2 + 1);
    }
    else {
      this_local = (parser *)0x0;
    }
  }
  return (size_t)this_local;
}

Assistant:

std::size_t occurrences_of(const parameter* p) const
    {
        if(!p) return 0;

        auto i = std::find_if(args_.rbegin(), args_.rend(),
            [p](const arg_mapping& a){ return a.param() == p; });

        if(i != args_.rend()) return i->repeat() + 1;
        return 0;
    }